

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearize.c
# Opt level: O3

pseudo_t dmrC_insert_phi_node(dmr_C *C,basic_block *bb,symbol *type)

{
  char cVar1;
  symbol *ptr;
  pseudo_t ppVar2;
  char *pcVar3;
  int iVar4;
  undefined1 local_50 [8];
  ptr_list_iter insniter__;
  
  ptr = (symbol *)alloc_typed_instruction(C,0x2e,type);
  ppVar2 = (pseudo_t)dmrC_allocator_allocate(&C->L->pseudo_allocator,0);
  ppVar2->type = PSEUDO_REG;
  iVar4 = C->L->nr + 1;
  C->L->nr = iVar4;
  ppVar2->nr = iVar4;
  (ppVar2->field_5).sym = ptr;
  ((anon_union_8_2_14638a90_for_instruction_5 *)&ptr->next_id)->target = ppVar2;
  *(basic_block **)&(ptr->pos).field_0x4 = bb;
  insniter__._16_8_ = bb;
  ptrlist_forward_iterator((ptr_list_iter *)local_50,(ptr_list *)bb->insns);
  do {
    pcVar3 = (char *)ptrlist_iter_next((ptr_list_iter *)local_50);
    if (pcVar3 == (char *)0x0) {
      ptrlist_add((ptr_list **)(insniter__._16_8_ + 0x30),ptr,&C->ptrlist_allocator);
      return ppVar2;
    }
    cVar1 = *pcVar3;
    if ((cVar1 != '\x01') && (cVar1 != '.')) {
      ptrlist_iter_insert((ptr_list_iter *)local_50,ptr);
    }
  } while ((cVar1 == '.') || (cVar1 == '\x01'));
  return ppVar2;
}

Assistant:

pseudo_t dmrC_insert_phi_node(struct dmr_C *C, struct basic_block *bb, struct symbol *type)
{
	struct instruction *phi_node = alloc_typed_instruction(C, OP_PHI, type);
	struct instruction *insn;
	pseudo_t phi;

	phi = dmrC_alloc_pseudo(C, phi_node);
	phi_node->target = phi;
	phi_node->bb = bb;

	FOR_EACH_PTR(bb->insns, insn) {
		enum opcode op = insn->opcode;
		if (op == OP_ENTRY || op == OP_PHI)
			continue;
		INSERT_CURRENT(phi_node, insn);
		return phi;
	} END_FOR_EACH_PTR(insn);

	dmrC_add_instruction(C, &bb->insns, phi_node);
	return phi;
}